

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_save_select_show_hash_option.hpp
# Opt level: O1

void __thiscall
PatchSaveSelectShowHashOption::alter_rom(PatchSaveSelectShowHashOption *this,ROM *rom)

{
  size_type sVar1;
  ROM *this_00;
  uint8_t i;
  long lVar2;
  long *plVar3;
  char *pcVar4;
  long *plVar5;
  char *pcVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ret_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ret;
  uchar local_99;
  long *local_98;
  size_type local_90;
  long local_88 [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  ROM *local_38;
  
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Hash","");
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = rom;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&local_58,local_90);
  if (local_90 != 0) {
    plVar3 = (long *)((long)local_98 + local_90);
    plVar5 = local_98;
    do {
      lVar2 = 0;
      do {
        if ((&Symbols::TABLE)[lVar2] == (char)*plVar5) goto LAB_00175786;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x6c);
      lVar2 = 0xff;
LAB_00175786:
      local_99 = (uchar)lVar2;
      if (local_99 != 0xff) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,&local_99);
      }
      plVar5 = (long *)((long)plVar5 + 1);
    } while (plVar5 != plVar3);
  }
  this_00 = local_38;
  md::ROM::set_bytes(local_38,0x29a20,&local_58);
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  md::ROM::set_word(this_00,0x29a4b,0x100);
  md::ROM::set_word(this_00,0x294e8,0xffff);
  md::ROM::set_byte(this_00,0x29a4d,(uint8_t)(this->_hash_sentence)._M_string_length);
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (&local_78,(this->_hash_sentence)._M_string_length);
  sVar1 = (this->_hash_sentence)._M_string_length;
  if (sVar1 != 0) {
    pcVar6 = (this->_hash_sentence)._M_dataplus._M_p;
    pcVar4 = pcVar6 + sVar1;
    do {
      lVar2 = 0;
      do {
        if ((&Symbols::TABLE)[lVar2] == *pcVar6) goto LAB_00175874;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x6c);
      lVar2 = 0xff;
LAB_00175874:
      local_98 = (long *)CONCAT71(local_98._1_7_,(char)lVar2);
      if ((char)lVar2 != -1) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,
                   (uchar *)&local_98);
      }
      pcVar6 = pcVar6 + 1;
    } while (pcVar6 != pcVar4);
  }
  md::ROM::set_bytes(this_00,0x29a4e,&local_78);
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void alter_rom(md::ROM& rom)
    {
        // Replace "Copy" string by "Hash"
        rom.set_bytes(0x29A20, Symbols::bytes_for_symbols("Hash"));

        // Replace "Massan" by an empty string, and make this string the one shown for every map in the game
        rom.set_word(0x29A4B, 0x0100);
        rom.set_word(0x294E8, 0xFFFF);

        // Put hash sentence as string 4D
        rom.set_byte(0x29A4D, (uint8_t)_hash_sentence.size());
        rom.set_bytes(0x29A4E, Symbols::bytes_for_symbols(_hash_sentence));
    }